

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

enable_if_t<true,_uintwide_t<256U,_unsigned_int,_void,_true>_> *
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::limits_helper_max<true>(void)

{
  byte *pbVar1;
  long lVar2;
  uintwide_t<256U,_unsigned_int,_void,_true> *in_RDI;
  
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (in_RDI->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  uintwide_t(in_RDI);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)(in_RDI->values).super_array<unsigned_int,_8UL>.elems + lVar2) =
         0xffffffff;
  }
  pbVar1 = (byte *)((long)(in_RDI->values).super_array<unsigned_int,_8UL>.elems + 0x1f);
  *pbVar1 = *pbVar1 ^ 0x80;
  return in_RDI;
}

Assistant:

static constexpr auto limits_helper_max() -> std::enable_if_t<RePhraseIsSigned, uintwide_t>
    {
      uintwide_t result_max { };

      detail::fill_unsafe(result_max.values.begin(), result_max.values.end(), (std::numeric_limits<limb_type>::max)());

      constexpr auto high_bit_limb =
        static_cast<limb_type>
        (
          static_cast<limb_type>(UINT8_C(1)) << static_cast<unsigned>(std::numeric_limits<limb_type>::digits - static_cast<int>(INT8_C(1)))
        );

      result_max.values.back() ^= high_bit_limb;

      return result_max;
    }